

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O1

LispPTR N_OP_aset1(LispPTR data,LispPTR arrayarg,LispPTR inx)

{
  DLword *pDVar1;
  DLword *pDVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  
  if ((*(ushort *)((ulong)(arrayarg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 0xe) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar9 = (ulong)data;
  if ((arrayarg & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arrayarg);
  }
  pDVar1 = Lisp_world;
  if ((inx & 0xfff0000) == 0xe0000) {
    uVar7 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)inx);
    }
    uVar7 = *(uint *)(Lisp_world + inx);
    if ((int)uVar7 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar2 = MDStypetbl;
  if (*(int *)(pDVar1 + (ulong)arrayarg + 6) <= (int)uVar7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar7 = uVar7 + pDVar1[(ulong)arrayarg + 2];
  uVar3 = *(uint *)(pDVar1 + arrayarg);
  uVar6 = (ulong)(uVar3 & 0xfffffff);
  bVar4 = (byte)pDVar1[(ulong)arrayarg + 3];
  uVar5 = data >> 8;
  if (bVar4 < 0x26) {
    if (bVar4 < 4) {
      if (bVar4 != 0) {
        if (bVar4 != 3) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xfff0000) == 0xe0000) {
          uVar3 = data & 0xffff;
        }
        else {
          if ((*(ushort *)((ulong)(uVar5 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
          if ((data & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
          }
          uVar3 = *(uint *)(Lisp_world + uVar9);
          if ((int)uVar3 < 0) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
        }
        if (0xff < uVar3) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)uVar7 + uVar6 * 2 ^ 3) = (char)uVar3;
        return data;
      }
      if ((data & 0xfff0000) == 0xe0000) {
        uVar5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar5 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        uVar5 = *(uint *)(Lisp_world + uVar9);
        if ((int)uVar5 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (1 < uVar5) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pbVar8 = (byte *)((long)Lisp_world + (ulong)(uVar7 >> 3) + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3)
      ;
      bVar4 = *pbVar8;
      if (uVar5 == 0) {
        bVar4 = bVar4 & (char)(-1 << (~(byte)uVar7 & 7)) - 1U;
      }
      else {
        bVar4 = bVar4 | (byte)(1 << (~(byte)uVar7 & 7));
      }
      *pbVar8 = bVar4;
      return data;
    }
    if (bVar4 == 4) {
      if ((data & 0xfff0000) == 0xe0000) {
        uVar3 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar5 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        uVar3 = *(uint *)(Lisp_world + uVar9);
        if ((int)uVar3 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (0xffff < uVar3) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      *(short *)((ulong)(Lisp_world + uVar6 + uVar7) ^ 2) = (short)uVar3;
      return data;
    }
    if (bVar4 == 0x14) {
      if ((data & 0xfff8000) != 0xe0000 && (data & 0xfff8000) != 0xf8000) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
LAB_0010990b:
      *(short *)((ulong)(Lisp_world + uVar6 + uVar7) ^ 2) = (short)data;
      return data;
    }
    if (bVar4 != 0x16) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((data & 0xfff0000) == 0xf0000) {
      uVar5 = data | 0xffff0000;
      goto LAB_00109af6;
    }
    if ((data & 0xfff0000) == 0xe0000) {
      uVar5 = data & 0xffff;
      goto LAB_00109af6;
    }
    if ((*(ushort *)((ulong)(uVar5 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else {
    if (0x42 < bVar4) {
      if (bVar4 == 0x43) {
        if (((data & 0xfff0000) == 0x70000) && ((data & 0xff00) == 0)) {
          *(char *)((long)Lisp_world + (ulong)uVar7 + uVar6 * 2 ^ 3) = (char)data;
          return data;
        }
      }
      else if (bVar4 == 0x44) {
        if ((data & 0xfff0000) == 0x70000) goto LAB_0010990b;
      }
      else if (bVar4 == 0x56) {
        if ((uVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
        }
        *(LispPTR *)(Lisp_world + uVar6 + (ulong)uVar7 * 2) = data;
        return data;
      }
      MachineState.errorexit = 1;
      MachineState.tosvalue = inx;
      return 0xffffffff;
    }
    if (bVar4 == 0x26) {
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
      }
      uVar9 = (ulong)uVar7;
      if ((-1 < *(short *)((ulong)(pDVar2 + (*(uint *)(Lisp_world + uVar6 + uVar9 * 2) >> 9)) ^ 2))
         && (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          if ((uVar3 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
          }
          rec_htfind(*(LispPTR *)(Lisp_world + uVar6 + uVar9 * 2),1);
        }
        else {
          if ((uVar3 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
          }
          htfind(*(LispPTR *)(Lisp_world + uVar6 + uVar9 * 2),1);
        }
      }
      if ((-1 < *(short *)((ulong)(uVar5 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          rec_htfind(data,0);
        }
        else {
          htfind(data,0);
        }
      }
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
      }
      *(LispPTR *)(Lisp_world + uVar6 + uVar9 * 2) = data;
      return data;
    }
    if (bVar4 != 0x36) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((*(ushort *)((ulong)(data >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 3) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((data & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
  }
  uVar5 = *(uint *)(Lisp_world + uVar9);
LAB_00109af6:
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
  }
  *(uint *)(Lisp_world + uVar6 + (ulong)uVar7 * 2) = uVar5;
  return data;
}

Assistant:

LispPTR N_OP_aset1(LispPTR data, LispPTR arrayarg, LispPTR inx) {
  OneDArray *arrayblk;
  LispPTR base;
  int index;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_ONED_ARRAY) ERROR_EXIT(inx);
  arrayblk = (OneDArray *)NativeAligned4FromLAddr(arrayarg);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);
  if (index >= arrayblk->totalsize) ERROR_EXIT(inx);
  index += arrayblk->offset;

  /*  setup base  */
  base = arrayblk->base;

  /*  dispatch on type  */
  aset_switch(arrayblk->typenumber, inx);

doufn:
  ERROR_EXIT(inx);

}